

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O3

void __thiscall llvm::AppleAcceleratorTable::Entry::Entry(Entry *this,HeaderData *HdrData)

{
  SmallVector<llvm::DWARFFormValue,_3U> *this_00;
  void *pvVar1;
  SmallVectorImpl<llvm::DWARFFormValue> *pSVar2;
  ulong MinCapacity;
  long lVar3;
  DWARFFormValue local_70;
  Entry *local_40;
  SmallVectorStorage<llvm::DWARFFormValue,_3U> *local_38;
  
  this_00 = &(this->super_Entry).Values;
  local_38 = &(this->super_Entry).Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>;
  (this->super_Entry).Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
  super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
  super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX =
       local_38;
  pSVar2 = &(this->super_Entry).Values.super_SmallVectorImpl<llvm::DWARFFormValue>;
  (pSVar2->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
  super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Size = 0;
  (pSVar2->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
  super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Capacity = 3;
  (this->super_Entry)._vptr_Entry = (_func_int **)&PTR_getCUOffset_01077e68;
  this->HdrData = HdrData;
  MinCapacity = (ulong)(HdrData->Atoms).
                       super_SmallVectorImpl<std::pair<unsigned_short,_llvm::dwarf::Form>_>.
                       super_SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false>
                       .
                       super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>
                       .super_SmallVectorBase.Size;
  local_40 = this;
  if (3 < MinCapacity) {
    SmallVectorBase::grow_pod((SmallVectorBase *)this_00,local_38,MinCapacity,0x30);
    MinCapacity = (ulong)(HdrData->Atoms).
                         super_SmallVectorImpl<std::pair<unsigned_short,_llvm::dwarf::Form>_>.
                         super_SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false>
                         .
                         super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>
                         .super_SmallVectorBase.Size;
  }
  if ((int)MinCapacity != 0) {
    pvVar1 = (HdrData->Atoms).super_SmallVectorImpl<std::pair<unsigned_short,_llvm::dwarf::Form>_>.
             super_SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false>.
             super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>.
             super_SmallVectorBase.BeginX;
    lVar3 = 0;
    do {
      local_70.Form = *(Form *)((long)pvVar1 + lVar3 + 2);
      local_70.Value.field_0.uval = 0;
      local_70.Value.data = (uint8_t *)0x0;
      local_70.U = (DWARFUnit *)0x0;
      local_70.C = (DWARFContext *)0x0;
      SmallVectorTemplateBase<llvm::DWARFFormValue,_true>::push_back
                ((SmallVectorTemplateBase<llvm::DWARFFormValue,_true> *)this_00,&local_70);
      lVar3 = lVar3 + 4;
    } while (MinCapacity << 2 != lVar3);
  }
  return;
}

Assistant:

AppleAcceleratorTable::Entry::Entry(
    const AppleAcceleratorTable::HeaderData &HdrData)
    : HdrData(&HdrData) {
  Values.reserve(HdrData.Atoms.size());
  for (const auto &Atom : HdrData.Atoms)
    Values.push_back(DWARFFormValue(Atom.second));
}